

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O3

void __thiscall QDoubleSpinBoxPrivate::QDoubleSpinBoxPrivate(QDoubleSpinBoxPrivate *this)

{
  QVariant *this_00;
  long in_FS_OFFSET;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractSpinBoxPrivate::QAbstractSpinBoxPrivate(&this->super_QAbstractSpinBoxPrivate);
  *(undefined ***)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate =
       &PTR__QAbstractSpinBoxPrivate_007fa6a0;
  *(undefined4 *)&this->actualMin = 0;
  *(undefined4 *)((long)&this->actualMin + 4) = 0;
  *(undefined4 *)&this->actualMax = 0x28f5c28f;
  *(undefined4 *)((long)&this->actualMax + 4) = 0x4058ff5c;
  ::QVariant::QVariant(&local_40,0.0);
  this_00 = &(this->super_QAbstractSpinBoxPrivate).minimum;
  ::QVariant::operator=(this_00,&local_40);
  ::QVariant::~QVariant(&local_40);
  ::QVariant::QVariant(&local_40,this->actualMax);
  ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).maximum,&local_40);
  ::QVariant::~QVariant(&local_40);
  ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).value,this_00);
  ::QVariant::QVariant(&local_40,1.0);
  ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).singleStep,&local_40);
  ::QVariant::~QVariant(&local_40);
  *(undefined4 *)&(this->super_QAbstractSpinBoxPrivate).field_0x3d4 = 2;
  (this->super_QAbstractSpinBoxPrivate).type = Double;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDoubleSpinBoxPrivate::QDoubleSpinBoxPrivate()
{
    actualMin = 0.0;
    actualMax = 99.99;
    minimum = QVariant(actualMin);
    maximum = QVariant(actualMax);
    value = minimum;
    singleStep = QVariant(1.0);
    decimals = 2;
    type = QMetaType::Double;
}